

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int it_read_sample_header(IT_SAMPLE *sample,uchar *convert,int32 *offset,DUMBFILE *f)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uchar uVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  int32 iVar8;
  
  iVar5 = dumbfile_mgetl(f);
  if (iVar5 == 0x494d) {
    uVar6 = dumbfile_mgetw(f);
    if ((uVar6 & 0xb6b2ffff) != 0x5053) {
      return -1;
    }
  }
  dumbfile_getnc((char *)sample->filename,0xd,f);
  sample->filename[0xd] = '\0';
  iVar7 = dumbfile_getc(f);
  sample->global_volume = (uchar)iVar7;
  iVar7 = dumbfile_getc(f);
  sample->flags = (uchar)iVar7;
  iVar7 = dumbfile_getc(f);
  sample->default_volume = (uchar)iVar7;
  dumbfile_getnc((char *)sample,0x1a,f);
  sample->name[0x1a] = '\0';
  iVar7 = dumbfile_getc(f);
  *convert = (uchar)iVar7;
  iVar7 = dumbfile_getc(f);
  sample->default_pan = (uchar)iVar7;
  iVar8 = dumbfile_igetl(f);
  sample->length = iVar8;
  iVar8 = dumbfile_igetl(f);
  sample->loop_start = iVar8;
  iVar8 = dumbfile_igetl(f);
  sample->loop_end = iVar8;
  iVar8 = dumbfile_igetl(f);
  sample->C5_speed = iVar8;
  iVar8 = dumbfile_igetl(f);
  sample->sus_loop_start = iVar8;
  uVar6 = dumbfile_igetl(f);
  sample->sus_loop_end = uVar6;
  bVar1 = sample->flags;
  if ((bVar1 & 1) != 0) {
    uVar2 = sample->length;
    if ((int)uVar2 < 1) {
      sample->flags = bVar1 & 0xfe;
    }
    else {
      uVar3 = sample->loop_end;
      if ((uVar2 < uVar3) || (uVar3 <= (uint)sample->loop_start)) {
        sample->flags = bVar1 & 0xef;
      }
      if ((uVar2 < uVar6) || (uVar6 <= (uint)sample->sus_loop_start)) {
        sample->flags = sample->flags & 0xdf;
      }
      if (((sample->flags & 0x10) != 0) && (*convert != 0xff)) {
        if ((int)uVar6 < (int)uVar3 || (sample->flags & 0x20) == 0) {
          sample->length = uVar3;
        }
        else {
          sample->length = uVar6;
        }
      }
    }
  }
  iVar8 = dumbfile_igetl(f);
  *offset = iVar8;
  iVar7 = dumbfile_getc(f);
  sample->vibrato_speed = (uchar)iVar7;
  iVar7 = dumbfile_getc(f);
  sample->vibrato_depth = (uchar)iVar7;
  if (iVar5 == 0x494d) {
    sample->vibrato_rate = '\0';
    uVar4 = '\0';
  }
  else {
    iVar7 = dumbfile_getc(f);
    sample->vibrato_rate = (uchar)iVar7;
    iVar7 = dumbfile_getc(f);
    uVar4 = (uchar)iVar7;
  }
  sample->vibrato_waveform = uVar4;
  sample->finetune = 0;
  sample->max_resampling_quality = -1;
  iVar7 = dumbfile_error(f);
  return iVar7;
}

Assistant:

static int it_read_sample_header(IT_SAMPLE *sample, unsigned char *convert, int32 *offset, DUMBFILE *f)
{
	/* XXX
	if (dumbfile_mgetl(f) != IT_SAMPLE_SIGNATURE)
		return -1;*/
	int hax = 0;
	int32 s = dumbfile_mgetl(f);
	if (s != IT_SAMPLE_SIGNATURE) {
		if ( s == ( IT_SAMPLE_SIGNATURE >> 16 ) ) {
			s <<= 16;
			s |= dumbfile_mgetw(f);
			if ( s != IT_SAMPLE_SIGNATURE )
				return -1;
			hax = 1;
		}
	}

    dumbfile_getnc((char *)sample->filename, 13, f);
	sample->filename[13] = 0;

	sample->global_volume = dumbfile_getc(f);
	sample->flags = dumbfile_getc(f);
	sample->default_volume = dumbfile_getc(f);

    dumbfile_getnc((char *)sample->name, 26, f);
	sample->name[26] = 0;

	*convert = dumbfile_getc(f);
	sample->default_pan = dumbfile_getc(f);
	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);
	sample->C5_speed = dumbfile_igetl(f);
	sample->sus_loop_start = dumbfile_igetl(f);
	sample->sus_loop_end = dumbfile_igetl(f);

#ifdef STEREO_SAMPLES_COUNT_AS_TWO
	if (sample->flags & IT_SAMPLE_STEREO) {
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
		sample->C5_speed >>= 1;
		sample->sus_loop_start >>= 1;
		sample->sus_loop_end >>= 1;
	}
#endif

	if (sample->flags & IT_SAMPLE_EXISTS) {
		if (sample->length <= 0)
			sample->flags &= ~IT_SAMPLE_EXISTS;
		else {
			if ((unsigned int)sample->loop_end > (unsigned int)sample->length)
				sample->flags &= ~IT_SAMPLE_LOOP;
			else if ((unsigned int)sample->loop_start >= (unsigned int)sample->loop_end)
				sample->flags &= ~IT_SAMPLE_LOOP;

			if ((unsigned int)sample->sus_loop_end > (unsigned int)sample->length)
				sample->flags &= ~IT_SAMPLE_SUS_LOOP;
			else if ((unsigned int)sample->sus_loop_start >= (unsigned int)sample->sus_loop_end)
				sample->flags &= ~IT_SAMPLE_SUS_LOOP;

			/* We may be able to truncate the sample to save memory. */
			if (sample->flags & IT_SAMPLE_LOOP &&
				*convert != 0xFF) { /* not truncating compressed samples, for now... */
				if ((sample->flags & IT_SAMPLE_SUS_LOOP) && sample->sus_loop_end >= sample->loop_end)
					sample->length = sample->sus_loop_end;
				else
					sample->length = sample->loop_end;
			}
		}
	}

	*offset = dumbfile_igetl(f);

	sample->vibrato_speed = dumbfile_getc(f);
	sample->vibrato_depth = dumbfile_getc(f);
	if ( ! hax ) {
		sample->vibrato_rate = dumbfile_getc(f);
		sample->vibrato_waveform = dumbfile_getc(f);
	} else {
		sample->vibrato_rate = 0;
		sample->vibrato_waveform = 0;
	}
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}